

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

InterCode * __thiscall IrSim::icUnaryOp(IrSim *this,int kind,C_OP *t,C_OP *a1)

{
  InterCode *in_RDI;
  InterCode *this_00;
  Operand *in_stack_ffffffffffffff88;
  Operand *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  InterCode *in_stack_ffffffffffffffa0;
  
  this_00 = in_RDI;
  Operand::Operand((Operand *)in_RDI,(Operand *)in_RDI);
  Operand::Operand((Operand *)this_00,(Operand *)in_RDI);
  InterCode::InterCode
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  Operand::~Operand((Operand *)0x11e9fe);
  Operand::~Operand((Operand *)0x11ea08);
  return this_00;
}

Assistant:

InterCode icUnaryOp(int kind, C_OP &t, C_OP &a1) const { return InterCode(kind, t, a1); }